

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  int iVar6;
  void *pvVar7;
  float *pfVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  void *ptr;
  void *local_80;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  undefined4 local_60;
  Allocator *local_58;
  undefined4 local_50;
  uint local_4c;
  undefined8 local_48;
  long local_40;
  
  uVar1 = bottom_top_blob->c;
  uVar14 = (ulong)uVar1;
  uVar9 = bottom_top_blob->h * bottom_top_blob->w;
  local_68 = bottom_top_blob->elemsize;
  iVar6 = this->across_spatial;
  iVar2 = this->across_channel;
  if (iVar2 == 0 || iVar6 == 0) {
    if (iVar6 != 0 && iVar2 == 0) {
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar7 = bottom_top_blob->data;
      iVar6 = this->channel_shared;
      iVar2 = this->eps_mode;
      sVar3 = bottom_top_blob->cstep;
      uVar10 = 0;
      do {
        fVar15 = 0.0;
        if (0 < (int)uVar9) {
          uVar11 = 0;
          do {
            fVar16 = *(float *)((long)pvVar7 + uVar11 * 4);
            fVar15 = fVar15 + fVar16 * fVar16;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        if (iVar2 == 0) {
          fVar15 = fVar15 + this->eps;
LAB_0015fb1f:
          fVar16 = SQRT(fVar15);
        }
        else {
          if (iVar2 != 1) {
            if (fVar15 <= this->eps) {
              fVar15 = this->eps;
            }
            goto LAB_0015fb1f;
          }
          fVar16 = SQRT(fVar15);
          if (SQRT(fVar15) <= this->eps) {
            fVar16 = this->eps;
          }
        }
        if (0 < (int)uVar9) {
          uVar11 = 0;
          if (iVar6 == 0) {
            uVar11 = uVar10;
          }
          fVar15 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
          uVar11 = 0;
          do {
            *(float *)((long)pvVar7 + uVar11 * 4) =
                 *(float *)((long)pvVar7 + uVar11 * 4) * fVar15 * (1.0 / fVar16);
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        uVar10 = uVar10 + 1;
        pvVar7 = (void *)((long)pvVar7 + local_68 * sVar3);
        if (uVar10 == uVar14) {
          return 0;
        }
      } while( true );
    }
    if (iVar2 == 0 || iVar6 != 0) {
      return 0;
    }
    local_58 = opt->workspace_allocator;
    local_78 = (void *)0x0;
    piStack_70 = (int *)0x0;
    local_60 = 1;
    local_50 = 1;
    local_48 = 0x100000001;
    local_40 = (long)(int)uVar9;
    if (uVar9 == 0) {
      return -100;
    }
    uVar10 = local_68 * local_40 + 3 & 0xfffffffffffffffc;
    local_4c = uVar9;
    if (local_58 == (Allocator *)0x0) {
      local_80 = (void *)0x0;
      iVar6 = posix_memalign(&local_80,0x10,uVar10 + 4);
      local_78 = (void *)0x0;
      if (iVar6 == 0) {
        local_78 = local_80;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))(local_58,uVar10 + 4);
    }
    piStack_70 = (int *)((long)local_78 + uVar10);
    *(undefined4 *)((long)local_78 + uVar10) = 1;
    if (this->channel_shared == 0) {
      if (0 < (int)uVar9) {
        pfVar8 = (float *)bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        iVar6 = this->eps_mode;
        uVar10 = 0;
        do {
          fVar15 = 0.0;
          uVar11 = uVar14;
          pfVar13 = pfVar8;
          if (0 < (int)uVar1) {
            do {
              fVar15 = fVar15 + *pfVar13 * *pfVar13;
              uVar11 = uVar11 - 1;
              pfVar13 = (float *)((long)pfVar13 + sVar3 * sVar4);
            } while (uVar11 != 0);
          }
          if (iVar6 == 0) {
            fVar15 = fVar15 + this->eps;
LAB_0015ffb4:
            fVar16 = SQRT(fVar15);
          }
          else {
            if (iVar6 != 1) {
              if (fVar15 <= this->eps) {
                fVar15 = this->eps;
              }
              goto LAB_0015ffb4;
            }
            fVar16 = SQRT(fVar15);
            if (SQRT(fVar15) <= this->eps) {
              fVar16 = this->eps;
            }
          }
          *(float *)((long)local_78 + uVar10 * 4) = 1.0 / fVar16;
          uVar10 = uVar10 + 1;
          pfVar8 = pfVar8 + 1;
        } while (uVar10 != uVar9);
      }
      if (0 < (int)uVar1) {
        pvVar7 = bottom_top_blob->data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pvVar5 = (this->scale_data).data;
        uVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            fVar15 = *(float *)((long)pvVar5 + uVar10 * 4);
            uVar11 = 0;
            do {
              *(float *)((long)pvVar7 + uVar11 * 4) =
                   *(float *)((long)pvVar7 + uVar11 * 4) * fVar15 *
                   *(float *)((long)local_78 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          uVar10 = uVar10 + 1;
          pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
        } while (uVar10 != uVar14);
      }
    }
    else {
      if (0 < (int)uVar9) {
        fVar15 = *(this->scale_data).data;
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pfVar8 = (float *)bottom_top_blob->data;
        iVar6 = this->eps_mode;
        uVar10 = 0;
        do {
          fVar16 = 0.0;
          uVar11 = uVar14;
          pfVar13 = pfVar8;
          if (0 < (int)uVar1) {
            do {
              fVar16 = fVar16 + *pfVar13 * *pfVar13;
              uVar11 = uVar11 - 1;
              pfVar13 = (float *)((long)pfVar13 + sVar3 * sVar4);
            } while (uVar11 != 0);
          }
          if (iVar6 == 0) {
            fVar16 = fVar16 + this->eps;
LAB_0015fed4:
            fVar17 = SQRT(fVar16);
          }
          else {
            if (iVar6 != 1) {
              if (fVar16 <= this->eps) {
                fVar16 = this->eps;
              }
              goto LAB_0015fed4;
            }
            fVar17 = SQRT(fVar16);
            if (SQRT(fVar16) <= this->eps) {
              fVar17 = this->eps;
            }
          }
          *(float *)((long)local_78 + uVar10 * 4) = fVar15 / fVar17;
          uVar10 = uVar10 + 1;
          pfVar8 = pfVar8 + 1;
        } while (uVar10 != uVar9);
      }
      if (0 < (int)uVar1) {
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pvVar7 = bottom_top_blob->data;
        uVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar7 + uVar11 * 4) =
                   *(float *)((long)local_78 + uVar11 * 4) * *(float *)((long)pvVar7 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          uVar10 = uVar10 + 1;
          pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
        } while (uVar10 != uVar14);
      }
    }
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 != 0) {
      return 0;
    }
    if (local_58 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_58 + 0x18))();
      return 0;
    }
    goto LAB_00160048;
  }
  local_40 = (long)(int)uVar1;
  local_58 = opt->workspace_allocator;
  local_78 = (void *)0x0;
  piStack_70 = (int *)0x0;
  local_60 = 1;
  local_50 = 1;
  local_48 = 0x100000001;
  if (uVar1 == 0) {
    return -100;
  }
  uVar10 = local_68 * local_40 + 3 & 0xfffffffffffffffc;
  local_4c = uVar1;
  if (local_58 == (Allocator *)0x0) {
    local_80 = (void *)0x0;
    iVar6 = posix_memalign(&local_80,0x10,uVar10 + 4);
    local_78 = (void *)0x0;
    if (iVar6 == 0) {
      local_78 = local_80;
    }
  }
  else {
    local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))(local_58,uVar10 + 4);
  }
  piStack_70 = (int *)((long)local_78 + uVar10);
  *(undefined4 *)((long)local_78 + uVar10) = 1;
  uVar10 = (ulong)uVar9;
  if ((int)uVar1 < 1) {
LAB_0015fd06:
    fVar15 = 0.0;
  }
  else {
    pvVar7 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    uVar11 = 0;
    do {
      fVar15 = 0.0;
      if (0 < (int)uVar9) {
        uVar12 = 0;
        do {
          fVar16 = *(float *)((long)pvVar7 + uVar12 * 4);
          fVar15 = fVar15 + fVar16 * fVar16;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      *(float *)((long)local_78 + uVar11 * 4) = fVar15;
      uVar11 = uVar11 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
    } while (uVar11 != uVar14);
    if ((int)uVar1 < 1) goto LAB_0015fd06;
    fVar15 = 0.0;
    uVar11 = 0;
    do {
      fVar15 = fVar15 + *(float *)((long)local_78 + uVar11 * 4);
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
  }
  if (this->eps_mode == 0) {
    fVar15 = fVar15 + this->eps;
LAB_0015fd3b:
    fVar16 = SQRT(fVar15);
  }
  else {
    if (this->eps_mode != 1) {
      if (fVar15 <= this->eps) {
        fVar15 = this->eps;
      }
      goto LAB_0015fd3b;
    }
    fVar16 = SQRT(fVar15);
    if (SQRT(fVar15) <= this->eps) {
      fVar16 = this->eps;
    }
  }
  if (this->channel_shared == 0) {
    if (0 < (int)uVar1) {
      pvVar7 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->cstep;
      sVar4 = bottom_top_blob->elemsize;
      pvVar5 = (this->scale_data).data;
      uVar11 = 0;
      do {
        if (0 < (int)uVar9) {
          fVar15 = *(float *)((long)pvVar5 + uVar11 * 4);
          uVar12 = 0;
          do {
            *(float *)((long)pvVar7 + uVar12 * 4) =
                 *(float *)((long)pvVar7 + uVar12 * 4) * fVar15 * (1.0 / fVar16);
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        uVar11 = uVar11 + 1;
        pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
      } while (uVar11 != uVar14);
    }
  }
  else if (0 < (int)uVar1) {
    fVar15 = *(this->scale_data).data;
    pvVar7 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    uVar11 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar12 = 0;
        do {
          *(float *)((long)pvVar7 + uVar12 * 4) =
               *(float *)((long)pvVar7 + uVar12 * 4) * (1.0 / fVar16) * fVar15;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      uVar11 = uVar11 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
    } while (uVar11 != uVar14);
  }
  LOCK();
  *piStack_70 = *piStack_70 + -1;
  UNLOCK();
  if (*piStack_70 != 0) {
    return 0;
  }
  if (local_58 != (Allocator *)0x0) {
    (**(code **)(*(long *)local_58 + 0x18))();
    return 0;
  }
LAB_00160048:
  if (local_78 != (void *)0x0) {
    free(local_78);
  }
  return 0;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = 1.f / sqrt(ssum + eps);
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = 1.f / sqrt(std::max(ssum, eps));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = 1.f / sqrt(ssum + eps);
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = 1.f / sqrt(std::max(ssum, eps));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrt(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrt(std::max(ssum, eps));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrt(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrt(std::max(ssum, eps));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}